

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProjectCommand.cxx
# Opt level: O1

void __thiscall
cmProjectCommand::TopLevelCMakeVarCondSet(cmProjectCommand *this,char *name,char *value)

{
  cmMakefile *pcVar1;
  bool bVar2;
  char *pcVar3;
  allocator<char> local_49;
  string local_48;
  
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  pcVar3 = cmMakefile::GetDefinition(pcVar1,&local_48);
  if (pcVar3 == (char *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar2 = cmMakefile::IsRootMakefile((this->super_cmCommand).Makefile);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (!bVar2) {
      return;
    }
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  cmMakefile::AddDefinition(pcVar1,&local_48,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (this->super_cmCommand).Makefile;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,name,&local_49);
  cmMakefile::AddCacheDefinition(pcVar1,&local_48,value,"Value Computed by CMake",STATIC,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmProjectCommand::TopLevelCMakeVarCondSet(const char* const name,
                                               const char* const value)
{
  // Set the CMAKE_PROJECT_XXX variable to be the highest-level
  // project name in the tree. If there are two project commands
  // in the same CMakeLists.txt file, and it is the top level
  // CMakeLists.txt file, then go with the last one.
  if (!this->Makefile->GetDefinition(name) ||
      (this->Makefile->IsRootMakefile())) {
    this->Makefile->AddDefinition(name, value);
    this->Makefile->AddCacheDefinition(name, value, "Value Computed by CMake",
                                       cmStateEnums::STATIC);
  }
}